

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGenGrid2D.cpp
# Opt level: O0

void __thiscall
TPZGenGrid2D::ElementConnectivity(TPZGenGrid2D *this,int64_t i,TPZVec<long> *rectangle_nodes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  long *plVar6;
  TPZVec<long> *in_RDX;
  ulong uVar7;
  ulong uVar8;
  long in_RSI;
  long *in_RDI;
  int layer;
  int yel;
  int xel;
  
  piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 1),0);
  uVar7 = in_RSI % (long)*piVar4;
  iVar1 = (int)uVar7;
  piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 1),0);
  iVar3 = *piVar4;
  piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 1),1);
  uVar8 = (in_RSI / (long)iVar3) % (long)*piVar4;
  iVar2 = (int)uVar8;
  piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 1),0);
  iVar3 = *piVar4;
  piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 1),1);
  uVar5 = in_RSI / (long)(iVar3 * *piVar4);
  if (((int)in_RDI[0x43] == 0) || ((int)in_RDI[0x43] == 1)) {
    iVar3 = (**(code **)(*in_RDI + 0x40))
                      (in_RDI,uVar7 & 0xffffffff,uVar8 & 0xffffffff,uVar5 & 0xffffffff);
    plVar6 = TPZVec<long>::operator[](in_RDX,0);
    *plVar6 = (long)iVar3;
    iVar3 = (**(code **)(*in_RDI + 0x40))(in_RDI,iVar1 + 1,uVar8 & 0xffffffff,uVar5 & 0xffffffff);
    plVar6 = TPZVec<long>::operator[](in_RDX,1);
    *plVar6 = (long)iVar3;
    iVar3 = (**(code **)(*in_RDI + 0x40))(in_RDI,iVar1 + 1,iVar2 + 1,uVar5 & 0xffffffff);
    plVar6 = TPZVec<long>::operator[](in_RDX,2);
    *plVar6 = (long)iVar3;
    iVar3 = (**(code **)(*in_RDI + 0x40))(in_RDI,uVar7 & 0xffffffff,iVar2 + 1,uVar5 & 0xffffffff);
    plVar6 = TPZVec<long>::operator[](in_RDX,3);
    *plVar6 = (long)iVar3;
  }
  else if ((int)in_RDI[0x43] == 7) {
    iVar3 = (**(code **)(*in_RDI + 0x40))(in_RDI,iVar1 << 1,iVar2 << 1,uVar5 & 0xffffffff);
    plVar6 = TPZVec<long>::operator[](in_RDX,0);
    *plVar6 = (long)iVar3;
    iVar3 = (**(code **)(*in_RDI + 0x40))(in_RDI,iVar1 * 2 + 2,iVar2 << 1,uVar5 & 0xffffffff);
    plVar6 = TPZVec<long>::operator[](in_RDX,1);
    *plVar6 = (long)iVar3;
    iVar3 = (**(code **)(*in_RDI + 0x40))(in_RDI,iVar1 * 2 + 2,iVar2 * 2 + 2,uVar5 & 0xffffffff);
    plVar6 = TPZVec<long>::operator[](in_RDX,2);
    *plVar6 = (long)iVar3;
    iVar3 = (**(code **)(*in_RDI + 0x40))(in_RDI,iVar1 << 1,iVar2 * 2 + 2,uVar5 & 0xffffffff);
    plVar6 = TPZVec<long>::operator[](in_RDX,3);
    *plVar6 = (long)iVar3;
    iVar3 = (**(code **)(*in_RDI + 0x40))(in_RDI,iVar1 * 2 + 1,iVar2 << 1,uVar5 & 0xffffffff);
    plVar6 = TPZVec<long>::operator[](in_RDX,4);
    *plVar6 = (long)iVar3;
    iVar3 = (**(code **)(*in_RDI + 0x40))(in_RDI,iVar1 * 2 + 2,iVar2 * 2 + 1,uVar5 & 0xffffffff);
    plVar6 = TPZVec<long>::operator[](in_RDX,5);
    *plVar6 = (long)iVar3;
    iVar3 = (**(code **)(*in_RDI + 0x40))(in_RDI,iVar1 * 2 + 1,iVar2 * 2 + 2,uVar5 & 0xffffffff);
    plVar6 = TPZVec<long>::operator[](in_RDX,6);
    *plVar6 = (long)iVar3;
    iVar3 = (**(code **)(*in_RDI + 0x40))(in_RDI,iVar1 << 1,iVar2 * 2 + 1,uVar5 & 0xffffffff);
    plVar6 = TPZVec<long>::operator[](in_RDX,7);
    *plVar6 = (long)iVar3;
    iVar3 = (**(code **)(*in_RDI + 0x40))(in_RDI,iVar1 * 2 + 1,iVar2 * 2 + 1,uVar5 & 0xffffffff);
    plVar6 = TPZVec<long>::operator[](in_RDX,8);
    *plVar6 = (long)iVar3;
  }
  return;
}

Assistant:

void TPZGenGrid2D::ElementConnectivity(int64_t i, TPZVec<int64_t> &rectangle_nodes) {
    int xel = i % (fNx[0]);
    int yel = (i / (fNx[0])) % (fNx[1]);
    int layer = i / (fNx[0] * fNx[1]);
    //cout << "ElConnectivity : xel = " << xel << " yel = " << yel << " layer = " << layer << endl;
    //cout.flush();
    if (fMeshType == MMeshType::EQuadrilateral || fMeshType == MMeshType::ETriangular) {
        rectangle_nodes[0] = GlobalI(xel, yel, layer);
        rectangle_nodes[1] = GlobalI(xel + 1, yel, layer);
        rectangle_nodes[2] = GlobalI(xel + 1, yel + 1, layer);
        rectangle_nodes[3] = GlobalI(xel, yel + 1, layer);
        //cout << "ElConnectivity : " << rectangle_nodes[0] << ' '<< rectangle_nodes[1] << ' '<<rectangle_nodes[2] << ' '<<rectangle_nodes[3] << endl;
        //cout.flush();
    } else if (fMeshType == MMeshType::ENoType) {
        rectangle_nodes[0] = GlobalI(2 * xel, 2 * yel, layer);
        rectangle_nodes[1] = GlobalI(2 * xel + 2, 2 * yel, layer);
        rectangle_nodes[2] = GlobalI(2 * xel + 2, 2 * yel + 2, layer);
        rectangle_nodes[3] = GlobalI(2 * xel, 2 * yel + 2, layer);
        rectangle_nodes[4] = GlobalI(2 * xel + 1, 2 * yel, layer);
        rectangle_nodes[5] = GlobalI(2 * xel + 2, 2 * yel + 1, layer);
        rectangle_nodes[6] = GlobalI(2 * xel + 1, 2 * yel + 2, layer);
        rectangle_nodes[7] = GlobalI(2 * xel, 2 * yel + 1, layer);
        rectangle_nodes[8] = GlobalI(2 * xel + 1, 2 * yel + 1, layer);
    }
}